

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

uint ntru_ring_invert(uint16_t *out,uint16_t *in,uint p,uint q)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint64_t qrecip_00;
  ulong factor1;
  uint16_t *__dest;
  uint16_t *b;
  ushort *b_00;
  void *b_01;
  ulong uVar8;
  uint16_t q_00;
  ulong local_108;
  size_t i_4;
  ulong uStack_f8;
  uint16_t scale;
  size_t j_7;
  ulong uStack_e8;
  uint success;
  size_t j_6;
  ulong uStack_d8;
  uint16_t Ac0;
  size_t j_5;
  size_t j_4;
  size_t j_3;
  uint16_t Bmult;
  uint16_t Amult;
  ulong uStack_b8;
  uint16_t diff_1;
  size_t j_2;
  ulong uStack_a8;
  uint16_t diff;
  size_t j_1;
  uint16_t swap_mask;
  ulong uStack_98;
  uint need_swap;
  size_t j;
  uint local_88;
  uint not_seen_top_term_of_B;
  uint not_seen_top_term_of_A;
  uint B_is_bigger;
  uint x_divides_B;
  uint x_divides_A;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  uint16_t *Bc;
  uint16_t *Ac;
  uint16_t *B;
  uint16_t *A;
  size_t STEPS;
  size_t SIZE;
  uint64_t qrecip;
  uint q_local;
  uint p_local;
  uint16_t *in_local;
  uint16_t *out_local;
  
  q_00 = (uint16_t)q;
  qrecip_00 = reciprocal_for_reduction(q_00);
  factor1 = (ulong)(p + 1);
  __dest = (uint16_t *)safemalloc(factor1,2,0);
  b = (uint16_t *)safemalloc(factor1,2,0);
  b_00 = (ushort *)safemalloc(factor1,2,0);
  b_01 = safemalloc(factor1,2,0);
  memcpy(__dest,in,(ulong)p << 1);
  __dest[p] = 0;
  *b_00 = 1;
  for (i_1 = 1; i_1 < factor1; i_1 = i_1 + 1) {
    b_00[i_1] = 0;
  }
  b[1] = q_00 - 1;
  *b = q_00 - 1;
  for (i_2 = 2; i_2 < p; i_2 = i_2 + 1) {
    b[i_2] = 0;
  }
  b[p] = 1;
  for (i_3 = 0; i_3 < factor1; i_3 = i_3 + 1) {
    *(undefined2 *)((long)b_01 + i_3 * 2) = 0;
  }
  for (_x_divides_B = 0; _x_divides_B < p * 2 + 1; _x_divides_B = _x_divides_B + 1) {
    uVar5 = iszero(*__dest);
    uVar6 = iszero(*b);
    not_seen_top_term_of_B = 0;
    local_88 = 1;
    j._4_4_ = 1;
    uStack_98 = factor1;
    while (uVar8 = uStack_98 - 1, uStack_98 != 0) {
      uVar7 = iszero(__dest[uVar8]);
      local_88 = uVar7 & local_88;
      uVar7 = iszero(b[uVar8]);
      j._4_4_ = uVar7 & j._4_4_;
      not_seen_top_term_of_B = (j._4_4_ ^ 0xffffffff) & local_88 | not_seen_top_term_of_B;
      uStack_98 = uVar8;
    }
    uVar1 = -((ushort)uVar6 | ((ushort)uVar5 ^ 0xffff) & (ushort)not_seen_top_term_of_B);
    for (uStack_a8 = 0; uStack_a8 < factor1; uStack_a8 = uStack_a8 + 1) {
      uVar2 = (__dest[uStack_a8] ^ b[uStack_a8]) & uVar1;
      __dest[uStack_a8] = __dest[uStack_a8] ^ uVar2;
      b[uStack_a8] = b[uStack_a8] ^ uVar2;
    }
    for (uStack_b8 = 0; uStack_b8 < factor1; uStack_b8 = uStack_b8 + 1) {
      uVar2 = (b_00[uStack_b8] ^ *(ushort *)((long)b_01 + uStack_b8 * 2)) & uVar1;
      b_00[uStack_b8] = b_00[uStack_b8] ^ uVar2;
      *(ushort *)((long)b_01 + uStack_b8 * 2) = *(ushort *)((long)b_01 + uStack_b8 * 2) ^ uVar2;
    }
    uVar1 = *b;
    uVar4 = *__dest;
    for (j_4 = 0; j_4 < factor1; j_4 = j_4 + 1) {
      uVar3 = reduce((uint)uVar1 * (uint)__dest[j_4] + (uint)(ushort)(q_00 - uVar4) * (uint)b[j_4],
                     q_00,qrecip_00);
      __dest[j_4] = uVar3;
    }
    for (j_5 = 0; j_5 < factor1; j_5 = j_5 + 1) {
      uVar3 = reduce((uint)uVar1 * (uint)b_00[j_5] +
                     (uint)(ushort)(q_00 - uVar4) * (uint)*(ushort *)((long)b_01 + j_5 * 2),q_00,
                     qrecip_00);
      b_00[j_5] = uVar3;
    }
    for (uStack_d8 = 1; uStack_d8 < factor1; uStack_d8 = uStack_d8 + 1) {
      __dest[uStack_d8 - 1] = __dest[uStack_d8];
    }
    __dest[factor1 - 1] = 0;
    uVar1 = *b_00;
    for (uStack_e8 = 1; uStack_e8 < p; uStack_e8 = uStack_e8 + 1) {
      b_00[uStack_e8 - 1] = b_00[uStack_e8];
    }
    b_00[p - 1] = uVar1;
    uVar4 = reduce((*b_00 + q) - (uint)uVar1,q_00,qrecip_00);
    *b_00 = uVar4;
  }
  uVar5 = iszero(*__dest);
  uVar6 = iszero(*b);
  j_7._4_4_ = uVar5 & (uVar6 ^ 1);
  for (uStack_f8 = 1; uStack_f8 < factor1; uStack_f8 = uStack_f8 + 1) {
    uVar5 = iszero(__dest[uStack_f8]);
    uVar6 = iszero(b[uStack_f8]);
    j_7._4_4_ = uVar5 & uVar6 & j_7._4_4_;
  }
  uVar4 = invert(*b,q_00,qrecip_00);
  for (local_108 = 0; local_108 < p; local_108 = local_108 + 1) {
    uVar3 = reduce((uint)uVar4 * (uint)*(ushort *)((long)b_01 + local_108 * 2),q_00,qrecip_00);
    out[local_108] = uVar3;
  }
  smemclr(__dest,factor1 << 1);
  safefree(__dest);
  smemclr(b,factor1 << 1);
  safefree(b);
  smemclr(b_00,factor1 << 1);
  safefree(b_00);
  smemclr(b_01,factor1 << 1);
  safefree(b_01);
  return j_7._4_4_;
}

Assistant:

unsigned ntru_ring_invert(uint16_t *out, const uint16_t *in,
                          unsigned p, unsigned q)
{
    SETUP;

    /* Size of the polynomial arrays we'll work with */
    const size_t SIZE = p+1;

    /* Number of steps of the algorithm is the max possible value of
     * deg A + deg B + 2, where deg A <= p-1 and deg B = p */
    const size_t STEPS = 2*p + 1;

    /* Our two working polynomials */
    uint16_t *A = snewn(SIZE, uint16_t);
    uint16_t *B = snewn(SIZE, uint16_t);

    /* Coefficient of the input value in each one */
    uint16_t *Ac = snewn(SIZE, uint16_t);
    uint16_t *Bc = snewn(SIZE, uint16_t);

    /* Initialise A to the input, and Ac correspondingly to 1 */
    memcpy(A, in, p*sizeof(uint16_t));
    A[p] = 0;
    Ac[0] = 1;
    for (size_t i = 1; i < SIZE; i++)
        Ac[i] = 0;

    /* Initialise B to the quotient polynomial of the ring, x^p-x-1
     * And Bc = 0 */
    B[0] = B[1] = q-1;
    for (size_t i = 2; i < p; i++)
        B[i] = 0;
    B[p] = 1;
    for (size_t i = 0; i < SIZE; i++)
        Bc[i] = 0;

    /* Run the gcd-finding algorithm. */
    for (size_t i = 0; i < STEPS; i++) {
        /*
         * First swap round so that A is the one we'll be dividing by x.
         *
         * In the case where one of the two polys has a zero constant
         * term, it's that one. In the other case, it's the one of
         * smaller degree. We must compute both, and choose between
         * them in a side-channel-safe way.
         */
        unsigned x_divides_A = iszero(A[0]);
        unsigned x_divides_B = iszero(B[0]);
        unsigned B_is_bigger = 0;
        {
            unsigned not_seen_top_term_of_A = 1, not_seen_top_term_of_B = 1;
            for (size_t j = SIZE; j-- > 0 ;) {
                not_seen_top_term_of_A &= iszero(A[j]);
                not_seen_top_term_of_B &= iszero(B[j]);
                B_is_bigger |= (~not_seen_top_term_of_B &
                                not_seen_top_term_of_A);
            }
        }
        unsigned need_swap = x_divides_B | (~x_divides_A & B_is_bigger);
        uint16_t swap_mask = -need_swap;
        for (size_t j = 0; j < SIZE; j++) {
            uint16_t diff = (A[j] ^ B[j]) & swap_mask;
            A[j] ^= diff;
            B[j] ^= diff;
        }
        for (size_t j = 0; j < SIZE; j++) {
            uint16_t diff = (Ac[j] ^ Bc[j]) & swap_mask;
            Ac[j] ^= diff;
            Bc[j] ^= diff;
        }

        /*
         * Replace A with a linear combination of both A and B that
         * has constant term zero, which we do by calculating
         *
         *   (constant term of B) * A - (constant term of A) * B
         *
         * In one of the two cases, A's constant term is already zero,
         * so the coefficient of B will be zero too; hence, this will
         * do nothing useful (it will merely scale A by some scalar
         * value), but it will take the same length of time as doing
         * something, which is just what we want.
         */
        uint16_t Amult = B[0], Bmult = q - A[0];
        for (size_t j = 0; j < SIZE; j++)
            A[j] = REDUCE(Amult * A[j] + Bmult * B[j]);
        /* And do the same transformation to Ac */
        for (size_t j = 0; j < SIZE; j++)
            Ac[j] = REDUCE(Amult * Ac[j] + Bmult * Bc[j]);

        /*
         * Now divide A by x, and compensate by multiplying Ac by
         * x^{p-1}-1 mod x^p-x-1.
         *
         * That multiplication is particularly easy, precisely because
         * x^{p-1}-1 is the multiplicative inverse of x! Each x^n term
         * for n>0 just moves down to the x^{n-1} term, and only the
         * constant term has to be dealt with in an interesting way.
         */
        for (size_t j = 1; j < SIZE; j++)
            A[j-1] = A[j];
        A[SIZE-1] = 0;
        uint16_t Ac0 = Ac[0];
        for (size_t j = 1; j < p; j++)
            Ac[j-1] = Ac[j];
        Ac[p-1] = Ac0;
        Ac[0] = REDUCE(Ac[0] + q - Ac0);
    }

    /*
     * Now we expect that A is 0, and B is a constant. If so, then
     * they are coprime, and we're going to return success. If not,
     * they have a common factor.
     */
    unsigned success = iszero(A[0]) & (1 ^ iszero(B[0]));
    for (size_t j = 1; j < SIZE; j++)
        success &= iszero(A[j]) & iszero(B[j]);

    /*
     * So we're going to return Bc, but first, scale it by the
     * multiplicative inverse of the constant we ended up with in
     * B[0].
     */
    uint16_t scale = INVERT(B[0]);
    for (size_t i = 0; i < p; i++)
        out[i] = REDUCE(scale * Bc[i]);

    smemclr(A, SIZE * sizeof(*A));
    sfree(A);
    smemclr(B, SIZE * sizeof(*B));
    sfree(B);
    smemclr(Ac, SIZE * sizeof(*Ac));
    sfree(Ac);
    smemclr(Bc, SIZE * sizeof(*Bc));
    sfree(Bc);

    return success;
}